

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::createTLExtra(QWidgetPrivate *this)

{
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var1;
  __uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> __p;
  QWExtra *pQVar2;
  long in_FS_OFFSET;
  __uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar2 == (QWExtra *)0x0) {
    createExtra(this);
    pQVar2 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  }
  if ((_Head_base<0UL,_QTLWExtra_*,_false>)
      *(QTLWExtra **)
       &(pQVar2->topextra)._M_t.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
        _M_t.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> ==
      (_Head_base<0UL,_QTLWExtra_*,_false>)0x0) {
    std::make_unique<QTLWExtra>();
    __p._M_t.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
    super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
         local_20._M_t.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
         super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl;
    local_20._M_t.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
    super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
         (tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_>)
         (_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>)0x0;
    std::__uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>::reset
              ((__uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> *)
               &((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
                 _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                 super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra,
               (pointer)__p._M_t.
                        super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl);
    std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::~unique_ptr
              ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)&local_20);
    _Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
    super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
    super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
         (((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
         super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
    *(undefined8 *)
     ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x10) = 0;
    *(undefined8 *)
     ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x18) = 0;
    *(undefined8 *)
     ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x88) = 0;
    *(undefined8 *)
     ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x90) = 0;
    *(undefined8 *)
     ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x98) = 0;
    *(undefined8 *)
     ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa0) = 0;
    *(undefined8 *)
     ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa8) = 0xfffffffefffffffe;
    *(undefined4 *)
     ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb0) = 0;
    *(ushort *)
     ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xe0) =
         (ushort)*(undefined4 *)
                  ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                         _M_t.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                         super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xe0) & 0xf000 |
         0xff;
    *(undefined8 *)
     ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x20) = 0;
    QWeakPointer<QObject>::assign<QObject>
              ((QWeakPointer<QObject> *)
               ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                      super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8),(QObject *)0x0)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::createTLExtra()
{
    if (!extra)
        createExtra();
    if (!extra->topextra) {
        extra->topextra = std::make_unique<QTLWExtra>();
        QTLWExtra* x = extra->topextra.get();
        x->backingStore = nullptr;
        x->sharedPainter = nullptr;
        x->incw = x->inch = 0;
        x->basew = x->baseh = 0;
        x->frameStrut.setCoords(0, 0, 0, 0);
        x->normalGeometry = QRect(0,0,-1,-1);
        x->savedFlags = { };
        x->opacity = 255;
        x->posIncludesFrame = 0;
        x->sizeAdjusted = false;
        x->embedded = 0;
        x->explicitContentsMarginsRespectsSafeArea = 0;
        x->window = nullptr;
        x->initialScreen = nullptr;

#ifdef QWIDGET_EXTRA_DEBUG
        static int count = 0;
        qDebug() << "tlextra" << ++count;
#endif
    }
}